

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PutVarint(uchar *p,u64 v)

{
  ulong in_RSI;
  byte *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RSI < 0x80) {
    *in_RDI = (byte)in_RSI & 0x7f;
    iVar1 = 1;
  }
  else if (in_RSI < 0x4000) {
    *in_RDI = (byte)(in_RSI >> 7) & 0x7f | 0x80;
    in_RDI[1] = (byte)in_RSI & 0x7f;
    iVar1 = 2;
  }
  else {
    iVar1 = putVarint64((uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (u64)in_RDI);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PutVarint(unsigned char *p, u64 v){
  if( v<=0x7f ){
    p[0] = v&0x7f;
    return 1;
  }
  if( v<=0x3fff ){
    p[0] = ((v>>7)&0x7f)|0x80;
    p[1] = v&0x7f;
    return 2;
  }
  return putVarint64(p,v);
}